

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_make_fileno_op(sexp ctx,sexp self,sexp_sint_t n,sexp fd,sexp no_closep)

{
  sexp psVar1;
  sexp_conflict local_30;
  sexp_gc_var_t local_28;
  
  local_30 = (sexp_conflict)0x43e;
  if (((ulong)fd & 1) == 0) {
    psVar1 = sexp_type_exception(ctx,self,2,fd);
    return psVar1;
  }
  if ((long)fd >> 1 < 0) {
    psVar1 = (sexp)&DAT_0000003e;
  }
  else {
    local_28.var = &local_30;
    local_28.next = (ctx->value).context.saves;
    (ctx->value).context.saves = &local_28;
    psVar1 = sexp_alloc_tagged_aux(ctx,0x20,0x12);
    if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
      (psVar1->value).fileno.fd = (long)fd >> 1;
      (psVar1->value).flonum_bits[0] = '\x01';
      (psVar1->value).flonum_bits[1] = no_closep != (sexp)&DAT_0000003e;
    }
    (ctx->value).context.saves = local_28.next;
  }
  return psVar1;
}

Assistant:

sexp sexp_make_fileno_op (sexp ctx, sexp self, sexp_sint_t n, sexp fd, sexp no_closep) {
  sexp_gc_var1(res);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, fd);
  if (sexp_unbox_fixnum(fd) < 0) return SEXP_FALSE;
#if SEXP_USE_UNIFY_FILENOS_BY_NUMBER
  res = sexp_lookup_fileno(ctx, sexp_unbox_fixnum(fd));
  if (sexp_filenop(res)) {
    sexp_fileno_no_closep(res) = sexp_truep(no_closep);
    sexp_fileno_openp(res) = 1;  /* not necessarily */
    return res;
  }
#endif
  sexp_gc_preserve1(ctx, res);
  res = sexp_alloc_type(ctx, fileno, SEXP_FILENO);
  if (!sexp_exceptionp(res)) {
    sexp_fileno_fd(res) = sexp_unbox_fixnum(fd);
    sexp_fileno_openp(res) = 1;
    sexp_fileno_no_closep(res) = sexp_truep(no_closep);
#if SEXP_USE_UNIFY_FILENOS_BY_NUMBER
    sexp_insert_fileno(ctx, res);
#endif
  }
  sexp_gc_release1(ctx);
  return res;
}